

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spectrum.h
# Opt level: O3

void __thiscall pbrt::BlackbodySpectrum::BlackbodySpectrum(BlackbodySpectrum *this,Float T)

{
  float fVar1;
  float n2;
  float fVar2;
  
  fVar2 = 0.0;
  this->T = T;
  if (0.0 < T) {
    fVar2 = (0.002897772 / T) * 1e+09 * 1e-09;
    fVar1 = expf(1.9864457e-25 / (fVar2 * 1.3806487e-23 * T));
    fVar2 = 1.1910428e-16 / ((fVar1 + -1.0) * fVar2 * fVar2 * fVar2 * fVar2 * fVar2);
    if (NAN(fVar2)) {
      LogFatal<char_const(&)[11]>
                (Fatal,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/spectrum.h"
                 ,0x4c,"Check failed: %s",(char (*) [11])"!IsNaN(Le)");
    }
  }
  this->normalizationFactor = 1.0 / fVar2;
  return;
}

Assistant:

PBRT_CPU_GPU
    BlackbodySpectrum(Float T) : T(T) {
        // Compute blackbody normalization constant for given temperature
        Float lambdaMax = Float(2.8977721e-3 / T * 1e9);
        normalizationFactor = 1 / Blackbody(lambdaMax, T);
    }